

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O0

void menu_item_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint left_00;
  uint top_00;
  uint width_00;
  uint height_00;
  Am_Value *pAVar8;
  ostream *poVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  Am_Wrapper *pAVar13;
  undefined8 in_stack_fffffffffffffd28;
  ulong uVar14;
  Am_Drawonable *pAVar15;
  uint uVar18;
  undefined8 uVar16;
  int *piVar17;
  ulong in_stack_fffffffffffffd30;
  uint uVar21;
  long lVar19;
  int *piVar20;
  undefined8 in_stack_fffffffffffffd38;
  undefined4 uVar22;
  bool local_1dd;
  bool local_149;
  Am_Object local_128;
  byte local_119;
  int local_118;
  int iStack_114;
  bool line_changed;
  int orig_top;
  int orig_left;
  int obj_top;
  int obj_left;
  int str_top;
  int str_left;
  int b;
  int a;
  int descent;
  int ascent;
  int str_width;
  Am_Style text_style;
  int check_height;
  Am_Style check_style;
  int topOffset;
  int leftOffset;
  Am_Style fill_color;
  Am_Image_Array local_b8;
  Am_Style local_b0;
  undefined1 local_a8 [8];
  Am_Value accel_value;
  Am_String accel_string;
  undefined1 local_88 [7];
  bool line;
  Am_Value value;
  Am_Object obj;
  Am_String string;
  Am_Widget_Look local_60;
  bool checked;
  bool draw_selected;
  Am_Widget_Look look;
  Computed_Colors_Record local_50;
  Computed_Colors_Record color_rec;
  Am_Font font;
  bool want_final_selected;
  bool active;
  bool interim_selected;
  bool selected;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *draw_local;
  Am_Object *self_local;
  
  uVar22 = (undefined4)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  uVar18 = (uint)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  pAVar8 = Am_Object::Get(self,100,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar8);
  left_00 = iVar7 + x_offset;
  pAVar8 = Am_Object::Get(self,0x65,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar8);
  top_00 = iVar7 + y_offset;
  pAVar8 = Am_Object::Get(self,0x66,0);
  width_00 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x67,0);
  height_00 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x172,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0x173,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0xcc,0);
  bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0x17b,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font((Am_Font *)&color_rec,pAVar8);
  pAVar8 = Am_Object::Get(self,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record(&local_50,pAVar8);
  pAVar8 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_60,pAVar8);
  local_149 = false;
  if (bVar2) {
    local_149 = bVar5;
  }
  pAVar8 = Am_Object::Get(self,0x1ab,3);
  bVar6 = Am_Value::Valid(pAVar8);
  Am_String::Am_String((Am_String *)&obj);
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_88);
  bVar1 = false;
  pAVar8 = Am_Object::Peek(self,0x1ae,0);
  Am_Value::operator=((Am_Value *)local_88,pAVar8);
  if ((local_88._0_2_ == 2) || (local_88._0_2_ == 4)) {
    bVar1 = true;
  }
  else if (local_88._0_2_ == 0x8008) {
    Am_String::operator=((Am_String *)&obj,(Am_Value *)local_88);
  }
  else {
    if (local_88._0_2_ != 0xa001) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar9 = std::operator<<(poVar9,"String slot of widget ");
      poVar9 = operator<<(poVar9,self);
      poVar9 = std::operator<<(poVar9," should have string or object type, but value is ");
      poVar9 = operator<<(poVar9,(Am_Value *)local_88);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Object::operator=((Am_Object *)&value.value,(Am_Value *)local_88);
  }
  Am_String::Am_String((Am_String *)&accel_value.value);
  Am_Value::Am_Value((Am_Value *)local_a8);
  pAVar8 = Am_Object::Peek(self,0x1e1,0);
  Am_Value::operator=((Am_Value *)local_a8,pAVar8);
  if (local_a8._0_2_ == 0x8008) {
    Am_String::operator=((Am_String *)&accel_value.value,(Am_Value *)local_a8);
  }
  uVar21 = (uint)(in_stack_fffffffffffffd30 >> 0x20);
  if (bVar1) {
    if (local_60.value == Am_MOTIF_LOOK_val) {
      uVar14 = (ulong)uVar18 << 0x20;
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&(local_50.data)->shadow_style,(ulong)left_00,(ulong)top_00,
                 (ulong)((left_00 - 1) + width_00),(ulong)top_00,uVar14);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&(local_50.data)->highlight_style,(ulong)left_00,(ulong)(top_00 + 1),
                 (ulong)((left_00 - 1) + width_00),(ulong)(top_00 + 1),uVar14 & 0xffffffff00000000);
    }
    else if (local_60.value == Am_WINDOWS_LOOK_val) {
      uVar14 = (ulong)uVar18 << 0x20;
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&(local_50.data)->background_style,(ulong)left_00,(ulong)(top_00 + 3),
                 (ulong)((left_00 - 1) + width_00),(ulong)(top_00 + 3),uVar14);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&(local_50.data)->highlight_style,(ulong)left_00,(ulong)(top_00 + 4),
                 (ulong)((left_00 - 1) + width_00),(ulong)(top_00 + 4),uVar14 & 0xffffffff00000000);
    }
    else {
      if (local_60.value != Am_MACINTOSH_LOOK_val) {
        Am_Error("Unknown Look parameter");
      }
      Am_Image_Array::Am_Image_Array(&local_b8,&Am_No_Image);
      uVar14 = 0;
      Am_Style::Am_Style(&local_b0,"grey",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,&local_b8);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&local_b0,(ulong)left_00,(ulong)(top_00 + 8),(ulong)((left_00 - 1) + width_00)
                 ,(ulong)(top_00 + 8),uVar14 & 0xffffffff00000000);
      Am_Style::~Am_Style(&local_b0);
      Am_Image_Array::~Am_Image_Array(&local_b8);
    }
    fill_color.data._4_4_ = 1;
  }
  else {
    if ((local_149 != false) || (bVar3)) {
      if (local_60.value == Am_MOTIF_LOOK_val) {
        pAVar15 = draw;
        Am_Draw_Motif_Box(left_00,top_00,width_00,height_00,false,&local_50,draw);
        uVar18 = (uint)((ulong)pAVar15 >> 0x20);
      }
      else if (local_60.value == Am_WINDOWS_LOOK_val) {
        pAVar8 = Am_Object::Get(self,0x1c9,0);
        Am_Style::Am_Style((Am_Style *)&topOffset,pAVar8);
        uVar16 = CONCAT44(uVar18,height_00);
        lVar19 = (ulong)uVar21 << 0x20;
        (*draw->_vptr_Am_Drawonable[0x2c])
                  (draw,&Am_No_Style,&topOffset,(ulong)left_00,(ulong)top_00,(ulong)width_00,uVar16,
                   lVar19);
        uVar18 = (uint)((ulong)uVar16 >> 0x20);
        uVar21 = (uint)((ulong)lVar19 >> 0x20);
        fill_color.data._4_4_ = 4;
        Am_Style::~Am_Style((Am_Style *)&topOffset);
      }
      else {
        if (local_60.value != Am_MACINTOSH_LOOK_val) {
          Am_Error("Unknown Look parameter");
        }
        uVar16 = CONCAT44(uVar18,height_00);
        in_stack_fffffffffffffd30 = in_stack_fffffffffffffd30 & 0xffffffff00000000;
        (*draw->_vptr_Am_Drawonable[0x2c])
                  (draw,&Am_No_Style,&Am_Black,(ulong)left_00,(ulong)top_00,(ulong)width_00,uVar16,
                   in_stack_fffffffffffffd30);
        uVar18 = (uint)((ulong)uVar16 >> 0x20);
        uVar21 = (uint)(in_stack_fffffffffffffd30 >> 0x20);
      }
    }
    pAVar8 = Am_Object::Get(self,0x1cd,0);
    check_style.data._4_4_ = Am_Value::operator_cast_to_int(pAVar8);
    pAVar8 = Am_Object::Get(self,0x1cb,0);
    check_style.data._0_4_ = Am_Value::operator_cast_to_int(pAVar8);
    if (bVar6) {
      (*draw->_vptr_Am_Drawonable[0x21])
                (draw,(ulong)left_00,(ulong)top_00,(ulong)width_00,(ulong)height_00);
      Am_Style::Am_Style((Am_Style *)&stack0xffffffffffffff28,&Am_Line_2);
      if (bVar4) {
        if ((local_60.value == Am_MACINTOSH_LOOK_val) && ((bVar3 || ((bVar2 && (bVar5)))))) {
          Am_Style::operator=((Am_Style *)&stack0xffffffffffffff28,&am_white_2);
        }
      }
      else {
        Am_Style::operator=((Am_Style *)&stack0xffffffffffffff28,&am_grey_2);
      }
      text_style.data._4_4_ = height_00 - 4;
      if (0xc < text_style.data._4_4_) {
        text_style.data._4_4_ = 0xc;
      }
      (*draw->_vptr_Am_Drawonable[0x2a])
                (draw,&stack0xffffffffffffff28,&Am_No_Style,(ulong)(left_00 + 2),
                 (ulong)(top_00 + (int)height_00 / 2),(ulong)(left_00 + 5),
                 CONCAT44(uVar18,top_00 + (int)(height_00 + text_style.data._4_4_) / 2),
                 CONCAT44(uVar21,left_00 + 10),
                 CONCAT44(uVar22,top_00 + (int)(height_00 - text_style.data._4_4_) / 2),0);
      (*draw->_vptr_Am_Drawonable[0x22])();
      Am_Style::~Am_Style((Am_Style *)&stack0xffffffffffffff28);
    }
    local_1dd = true;
    if (local_149 == false) {
      local_1dd = bVar3;
    }
    ascent = local_60.value;
    compute_text_style(SUB81(&str_width,0),bVar4,(Computed_Colors_Record *)(ulong)local_1dd,
                       (Am_Widget_Look)(Am_Widget_Look_vals)&local_50,local_60.value);
    pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&obj);
    if (pcVar10 == (char *)0x0) {
      bVar4 = Am_Object::Valid((Am_Object *)&value.value);
      if (bVar4) {
        orig_left = check_style.data._4_4_;
        orig_top = (int)check_style.data;
        pAVar8 = Am_Object::Get((Am_Object *)&value.value,100,0);
        iStack_114 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar8 = Am_Object::Get((Am_Object *)&value.value,0x65,0);
        local_118 = Am_Value::operator_cast_to_int(pAVar8);
        local_119 = 0;
        if (((bVar2) || (bVar3)) &&
           (bVar2 = Am_Widget_Look::operator==(&local_60,&Am_MACINTOSH_LOOK), bVar2)) {
          pAVar8 = Am_Object::Peek((Am_Object *)&value.value,0x6b,0);
          bVar2 = Am_Value::Exists(pAVar8);
          if (bVar2) {
            pAVar8 = Am_Object::Get((Am_Object *)&value.value,0x6b,0);
            pAVar13 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
            bVar2 = Am_Value::operator==(pAVar8,pAVar13);
            if (bVar2) {
              pAVar13 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_White);
              Am_Object::Set((Am_Object *)&value.value,0x6b,pAVar13,0);
              local_119 = 1;
            }
          }
        }
        (*draw->_vptr_Am_Drawonable[0x21])
                  (draw,(ulong)left_00,(ulong)top_00,(ulong)width_00,(ulong)height_00);
        Am_Object::Am_Object(&local_128,(Am_Object *)&value.value);
        Am_Draw(&local_128,draw,(left_00 - iStack_114) + orig_left,(top_00 - local_118) + orig_top);
        Am_Object::~Am_Object(&local_128);
        (*draw->_vptr_Am_Drawonable[0x22])();
        if ((local_119 & 1) != 0) {
          pAVar13 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
          Am_Object::Set((Am_Object *)&value.value,0x6b,pAVar13,0);
        }
      }
    }
    else {
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      pcVar11 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      sVar12 = strlen(pcVar11);
      piVar20 = &str_left;
      piVar17 = &b;
      (*draw->_vptr_Am_Drawonable[0x1a])
                (draw,&color_rec,pcVar10,sVar12 & 0xffffffff,&descent,&a,piVar17,piVar20,&str_top);
      uVar22 = (undefined4)((ulong)piVar17 >> 0x20);
      obj_left = left_00 + check_style.data._4_4_;
      obj_top = top_00 + (int)check_style.data;
      (*draw->_vptr_Am_Drawonable[0x21])
                (draw,(ulong)left_00,(ulong)top_00,(ulong)width_00,(ulong)height_00);
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      pcVar11 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      sVar12 = strlen(pcVar11);
      (*draw->_vptr_Am_Drawonable[0x2e])
                (draw,&str_width,pcVar10,sVar12 & 0xffffffff,&color_rec,(ulong)(uint)obj_left,
                 CONCAT44(uVar22,obj_top),(ulong)piVar20 & 0xffffffff00000000,&Am_No_Style,0);
      (*draw->_vptr_Am_Drawonable[0x22])();
    }
    pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&accel_value.value);
    if (pcVar10 != (char *)0x0) {
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&accel_value.value);
      pcVar11 = Am_String::operator_cast_to_char_((Am_String *)&accel_value.value);
      sVar12 = strlen(pcVar11);
      piVar20 = &str_left;
      piVar17 = &b;
      (*draw->_vptr_Am_Drawonable[0x1a])
                (draw,&color_rec,pcVar10,sVar12 & 0xffffffff,&descent,&a,piVar17,piVar20,&str_top);
      uVar22 = (undefined4)((ulong)piVar17 >> 0x20);
      obj_left = ((left_00 + width_00) - descent) + -5;
      obj_top = top_00 + (int)check_style.data;
      (*draw->_vptr_Am_Drawonable[0x21])
                (draw,(ulong)left_00,(ulong)top_00,(ulong)width_00,(ulong)height_00);
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&accel_value.value);
      pcVar11 = Am_String::operator_cast_to_char_((Am_String *)&accel_value.value);
      sVar12 = strlen(pcVar11);
      (*draw->_vptr_Am_Drawonable[0x2e])
                (draw,&str_width,pcVar10,sVar12 & 0xffffffff,&color_rec,(ulong)(uint)obj_left,
                 CONCAT44(uVar22,obj_top),(ulong)piVar20 & 0xffffffff00000000,&Am_No_Style,0);
      (*draw->_vptr_Am_Drawonable[0x22])();
    }
    Am_Style::~Am_Style((Am_Style *)&str_width);
    fill_color.data._4_4_ = 0;
  }
  Am_Value::~Am_Value((Am_Value *)local_a8);
  Am_String::~Am_String((Am_String *)&accel_value.value);
  Am_Value::~Am_Value((Am_Value *)local_88);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_String::~Am_String((Am_String *)&obj);
  Computed_Colors_Record::~Computed_Colors_Record(&local_50);
  Am_Font::~Am_Font((Am_Font *)&color_rec);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, menu_item_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool selected = self.Get(Am_SELECTED);
  bool interim_selected = self.Get(Am_INTERIM_SELECTED);
  bool active = self.Get(Am_ACTIVE);
  bool want_final_selected = self.Get(Am_FINAL_FEEDBACK_WANTED);
  Am_Font font(self.Get(Am_FONT));
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  bool draw_selected = selected && want_final_selected;
  bool checked = self.Get(Am_CHECKED_ITEM, Am_RETURN_ZERO_ON_ERROR).Valid();

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj;
  Am_Value value;
  bool line = false;

  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);

  switch (value.type) {
  case Am_STRING:
    string = value;
    break;

  case Am_OBJECT:
    obj = value;
    break;

  case Am_INT: // ok to fall thru ( Am_INT || Am_BOOL )
  case Am_BOOL:
    line = true;
    break;

  default:
    Am_ERRORO("String slot of widget "
                  << self << " should have string or object type, but value is "
                  << value,
              self, Am_REAL_STRING_OR_OBJ);
  }

  Am_String accel_string;
  Am_Value accel_value;
  accel_value = self.Peek(Am_ACCELERATOR_STRING);
  if (accel_value.type == Am_STRING)
    accel_string = accel_value;

  // let's draw it
  if (line) // if it's just a line, draw it.
  {
    switch (look.value) {
    case Am_MOTIF_LOOK_val:
      draw->Draw_Line(color_rec.data->shadow_style, left, top, left + width - 1,
                      top);
      draw->Draw_Line(color_rec.data->highlight_style, left, top + 1,
                      left + width - 1, top + 1);
      break;

    case Am_WINDOWS_LOOK_val:
      draw->Draw_Line(color_rec.data->background_style, left, top + 3,
                      left + width - 1, top + 3);
      draw->Draw_Line(color_rec.data->highlight_style, left, top + 4,
                      left + width - 1, top + 4);
      break;

    case Am_MACINTOSH_LOOK_val:
      draw->Draw_Line(Am_Style("grey", 1), left, top + 8, left + width - 1,
                      top + 8);
      break;

    default:
      Am_Error("Unknown Look parameter");
      break;
    }
    return;
  }

  if (draw_selected || interim_selected)
    switch (look.value) {
    case Am_MOTIF_LOOK_val:
      Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
      break;

    case Am_WINDOWS_LOOK_val: {
      Am_Style fill_color = self.Get(Am_MENU_SELECTED_COLOR);
      draw->Draw_Rectangle(Am_No_Style, fill_color, left, top, width, height);
      break;
    }

    case Am_MACINTOSH_LOOK_val:
      draw->Draw_Rectangle(Am_No_Style, Am_Black, left, top, width, height);
      break;

    default:
      Am_Error("Unknown Look parameter");
      break;
    }

  int leftOffset = self.Get(Am_MENU_ITEM_LEFT_OFFSET),
      topOffset = self.Get(Am_MENU_ITEM_TOP_OFFSET);

  if (checked) {
    draw->Push_Clip(left, top, width, height);
    Am_Style check_style = Am_Line_2;
    if (!active)
      check_style = am_grey_2;
    else if ((look.value == Am_MACINTOSH_LOOK_val) &&
             (interim_selected || (selected && want_final_selected)))
      check_style = am_white_2;
    int check_height = height - 4;
    if (check_height > 12)
      check_height = 12;
    draw->Draw_2_Lines(check_style, Am_No_Style, left + 2, top + (height / 2),
                       left + 5, top + ((height + check_height) / 2), left + 10,
                       top + ((height - check_height) / 2));
    draw->Pop_Clip();
  }

  // now draw the string if any
  Am_Style text_style =
      compute_text_style(active, draw_selected || interim_selected, color_rec,
                         look, Am_MENU_BUTTON);

  int str_width, ascent, descent, a, b, str_left, str_top;

  if ((const char *)string) {
    draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                             descent, a, b);

    // always left justify the text for now
    str_left = left + leftOffset;
    str_top = top + topOffset;

    // set a clip region in case string bigger than the button
    draw->Push_Clip(left, top, width, height);
    // does not correctly clip top and bottom
    draw->Draw_Text(text_style, string, strlen(string), font, str_left,
                    str_top);
    draw->Pop_Clip();
  } else if (obj.Valid()) {
    // left justify the object; since a part of the button, will be offset from
    // buttons' left and top automatically.
    int obj_left = leftOffset;
    int obj_top = topOffset;
    int orig_left = obj.Get(Am_LEFT);
    int orig_top = obj.Get(Am_TOP);

    // call the object's draw method to draw the component
    bool line_changed = false;
    if ((selected || interim_selected) && look == Am_MACINTOSH_LOOK) {
      if (obj.Peek(Am_LINE_STYLE).Exists()) {
        if (obj.Get(Am_LINE_STYLE) == Am_Black) {
          obj.Set(Am_LINE_STYLE, Am_White);
          line_changed = true;
        }
      }
    }

    draw->Push_Clip(left, top, width, height);
    Am_Draw(obj, draw, left - orig_left + obj_left, top - orig_top + obj_top);
    draw->Pop_Clip();

    if (line_changed)
      obj.Set(Am_LINE_STYLE, Am_Black);
  }

  if ((const char *)accel_string) {
    // always right justify the accel text
    draw->Get_String_Extents(font, accel_string, strlen(accel_string),
                             str_width, ascent, descent, a, b);
    str_left = left + width - str_width - 5;
    str_top = top + topOffset;

    // set a clip region in case string bigger than the button
    draw->Push_Clip(left, top, width, height);
    draw->Draw_Text(text_style, accel_string, strlen(accel_string), font,
                    str_left, str_top);
    draw->Pop_Clip();
  }
}